

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ReverseLayerParams::SerializeWithCachedSizes
          (ReverseLayerParams *this,CodedOutputStream *output)

{
  Rep *pRVar1;
  bool *a;
  
  if (0 < (this->reversedim_).current_size_) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,10);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_reversedim_cached_byte_size_);
    pRVar1 = (this->reversedim_).rep_;
    a = pRVar1->elements;
    if (pRVar1 == (Rep *)0x0) {
      a = (bool *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteBoolArray
              (a,(this->reversedim_).current_size_,output);
    return;
  }
  return;
}

Assistant:

void ReverseLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ReverseLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated bool reverseDim = 1;
  if (this->reversedim_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_reversedim_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteBoolArray(
      this->reversedim().data(), this->reversedim_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ReverseLayerParams)
}